

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

void Gia_ObjComputeTruthTable6Lut_rec(Gia_Man_t *p,int iObj,Vec_Wrd_t *vTemp)

{
  int iVar1;
  int i;
  Gia_Obj_t *pObj;
  word wVar2;
  word wVar3;
  
  pObj = Gia_ManObj(p,iObj);
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 != 0) {
    return;
  }
  Gia_ObjSetTravIdCurrentId(p,iObj);
  if ((-1 < (int)(uint)*(undefined8 *)pObj) &&
     (((uint)*(undefined8 *)pObj & 0x1fffffff) != 0x1fffffff)) {
    iVar1 = Gia_ObjFaninId0p(p,pObj);
    Gia_ObjComputeTruthTable6Lut_rec(p,iVar1,vTemp);
    iVar1 = Gia_ObjFaninId1p(p,pObj);
    Gia_ObjComputeTruthTable6Lut_rec(p,iVar1,vTemp);
    iVar1 = Gia_ObjFaninId0p(p,pObj);
    wVar2 = Vec_WrdEntry(vTemp,iVar1);
    iVar1 = *(int *)pObj;
    i = Gia_ObjFaninId1p(p,pObj);
    wVar3 = Vec_WrdEntry(vTemp,i);
    Vec_WrdWriteEntry(vTemp,iObj,
                      ((*(long *)pObj << 2) >> 0x3f ^ wVar3) &
                      ((long)((iVar1 << 2) >> 0x1f) ^ wVar2));
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                ,0x12d,"void Gia_ObjComputeTruthTable6Lut_rec(Gia_Man_t *, int, Vec_Wrd_t *)");
}

Assistant:

void Gia_ObjComputeTruthTable6Lut_rec( Gia_Man_t * p, int iObj, Vec_Wrd_t * vTemp )
{
    word uTruth0, uTruth1;
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjComputeTruthTable6Lut_rec( p, Gia_ObjFaninId0p(p, pObj), vTemp );
    Gia_ObjComputeTruthTable6Lut_rec( p, Gia_ObjFaninId1p(p, pObj), vTemp );
    uTruth0 = Vec_WrdEntry( vTemp, Gia_ObjFaninId0p(p, pObj) );
    uTruth0 = Gia_ObjFaninC0(pObj) ? ~uTruth0 : uTruth0;
    uTruth1 = Vec_WrdEntry( vTemp, Gia_ObjFaninId1p(p, pObj) );
    uTruth1 = Gia_ObjFaninC1(pObj) ? ~uTruth1 : uTruth1;
    Vec_WrdWriteEntry( vTemp, iObj, uTruth0 & uTruth1 );
}